

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::FixTrailingCommas::fix_comma
          (FixTrailingCommas *this,Fodder *last_comma_fodder,bool *trailing_comma,
          Fodder *close_fodder)

{
  bool bVar1;
  
  bVar1 = contains_newline(close_fodder);
  if (bVar1) {
    if (*trailing_comma == false) {
LAB_001a9806:
      *trailing_comma = true;
      return;
    }
  }
  else {
    bVar1 = contains_newline(last_comma_fodder);
    if (*trailing_comma == false) {
      if (!bVar1) {
        return;
      }
      goto LAB_001a9806;
    }
    if (!bVar1) {
      *trailing_comma = false;
      goto LAB_001a9814;
    }
  }
  bVar1 = contains_newline(last_comma_fodder);
  if (!bVar1) {
    return;
  }
LAB_001a9814:
  fodder_move_front(close_fodder,last_comma_fodder);
  return;
}

Assistant:

void fix_comma(Fodder &last_comma_fodder, bool &trailing_comma, Fodder &close_fodder)
    {
        bool need_comma = contains_newline(close_fodder) || contains_newline(last_comma_fodder);
        if (trailing_comma) {
            if (!need_comma) {
                // Remove it but keep fodder.
                trailing_comma = false;
                fodder_move_front(close_fodder, last_comma_fodder);
            } else if (contains_newline(last_comma_fodder)) {
                // The comma is needed but currently is separated by a newline.
                fodder_move_front(close_fodder, last_comma_fodder);
            }
        } else {
            if (need_comma) {
                // There was no comma, but there was a newline before the ] so add a comma.
                trailing_comma = true;
            }
        }
    }